

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::OptionException::OptionException(OptionException *this,string *message)

{
  *(undefined ***)this = &PTR__OptionException_0013fef0;
  std::__cxx11::string::string((string *)&this->m_message,(string *)message);
  return;
}

Assistant:

OptionException(const std::string& message)
                : m_message(message)
        {
        }